

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall
Catch::Detail::CaseInsensitiveEqualTo::operator()
          (CaseInsensitiveEqualTo *this,StringRef lhs,StringRef rhs)

{
  char cVar1;
  char cVar2;
  size_type sVar3;
  bool bVar4;
  
  if (lhs.m_size == rhs.m_size) {
    for (sVar3 = 0; bVar4 = lhs.m_size == sVar3, !bVar4; sVar3 = sVar3 + 1) {
      cVar2 = rhs.m_start[sVar3];
      cVar1 = toLower(lhs.m_start[sVar3]);
      cVar2 = toLower(cVar2);
      if (cVar1 != cVar2) {
        return bVar4;
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
        CaseInsensitiveEqualTo::operator()( StringRef lhs,
                                            StringRef rhs ) const {
            return std::equal(
                lhs.begin(), lhs.end(),
                rhs.begin(), rhs.end(),
                []( char l, char r ) { return toLower( l ) == toLower( r ); } );
        }